

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selfguided_sse4.c
# Opt level: O0

int av1_apply_selfguided_restoration_sse4_1
              (uint8_t *dat8,int width,int height,int stride,int eps,int *xqd,uint8_t *dst8,
              int dst_stride,int32_t *tmpbuf,int bit_depth,int highbd)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  undefined8 uVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  int iVar21;
  int iVar22;
  void *a;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  int *xq_00;
  long in_RDI;
  int in_R8D;
  int *in_R9;
  int iVar23;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  undefined8 extraout_XMM0_Qa_03;
  undefined8 extraout_XMM0_Qa_04;
  int iVar27;
  int iVar28;
  undefined8 extraout_XMM0_Qb;
  undefined1 extraout_XMM0 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  undefined8 extraout_XMM0_Qb_03;
  undefined8 extraout_XMM0_Qb_04;
  __m128i alVar29;
  __m128i v;
  long in_stack_00000008;
  int in_stack_00000010;
  long in_stack_00000018;
  byte in_stack_00000020;
  int in_stack_00000028;
  __m128i res_1;
  __m128i tmp_1;
  __m128i res;
  __m128i max;
  __m128i tmp;
  __m128i w_1;
  __m128i w_0;
  __m128i rounding;
  __m128i f2_1;
  __m128i f2_0;
  __m128i f1_1;
  __m128i f1_0;
  __m128i v_1;
  __m128i v_0;
  __m128i u_1;
  __m128i u_0;
  __m128i u;
  __m128i src;
  uint8_t *dat8ij;
  int m;
  int k;
  int j;
  int i;
  __m128i xq1;
  __m128i xq0;
  int xq [2];
  sgr_params_type *params;
  int ret;
  int32_t *flt1;
  int32_t *flt0;
  undefined8 local_538;
  undefined8 uStackY_530;
  undefined8 local_508;
  undefined8 uStackY_500;
  undefined4 in_stack_fffffffffffffb40;
  undefined4 in_stack_fffffffffffffb44;
  undefined4 in_stack_fffffffffffffb48;
  undefined4 in_stack_fffffffffffffb4c;
  int in_stack_fffffffffffffb54;
  int in_stack_fffffffffffffb58;
  int in_stack_fffffffffffffb5c;
  undefined4 in_stack_fffffffffffffb60;
  undefined4 in_stack_fffffffffffffb64;
  int local_488;
  int iStack_484;
  int in_stack_fffffffffffffb80;
  int iStack_47c;
  int in_stack_fffffffffffffb88;
  int iStack_474;
  int in_stack_fffffffffffffb90;
  int iStack_46c;
  int in_stack_fffffffffffffb98;
  undefined8 uVar30;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined1 local_438 [16];
  int local_410;
  int local_40c;
  int local_3e0;
  undefined4 local_3dc;
  sgr_params_type *local_3d8;
  int local_3cc;
  long local_3c8;
  long local_3c0;
  int *local_3b8;
  int local_3b0;
  int local_3ac;
  int local_3a8;
  int local_3a4;
  long local_3a0;
  int local_394;
  undefined4 local_390;
  int local_38c;
  undefined8 local_388;
  undefined4 local_36c;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined1 local_358 [16];
  undefined1 local_348 [16];
  undefined4 local_32c;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined4 local_30c;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  int local_2e8;
  int iStack_2e4;
  int iStack_2e0;
  int iStack_2dc;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  int local_2c8;
  int iStack_2c4;
  int iStack_2c0;
  int iStack_2bc;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  int local_2a8;
  int iStack_2a4;
  int iStack_2a0;
  int iStack_29c;
  undefined8 local_298;
  undefined8 uStack_290;
  int local_288;
  int iStack_284;
  int iStack_280;
  int iStack_27c;
  undefined8 local_268;
  undefined8 uStack_260;
  int local_258;
  int iStack_254;
  int iStack_250;
  int iStack_24c;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined1 local_238 [16];
  undefined8 local_228;
  undefined8 uStack_220;
  undefined1 local_218 [16];
  undefined8 local_208;
  undefined8 uStack_200;
  undefined1 local_1f8 [16];
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined1 local_1d8 [16];
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined4 local_12c;
  int local_128;
  int iStack_124;
  int iStack_120;
  int iStack_11c;
  undefined4 local_10c;
  int local_108;
  int iStack_104;
  int iStack_100;
  int iStack_fc;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  short local_ca;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  undefined4 local_38;
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  undefined8 local_28;
  undefined8 uStack_20;
  short local_18;
  short local_16;
  short local_14;
  short local_12;
  short local_10;
  short local_e;
  short local_c;
  short local_a;
  
  local_3c0 = in_stack_00000018;
  local_3c8 = in_stack_00000018 + 0x9dcd0;
  local_3b8 = in_R9;
  local_3b0 = in_R8D;
  local_3ac = in_ECX;
  local_3a8 = in_EDX;
  local_3a4 = in_ESI;
  local_3a0 = in_RDI;
  local_3cc = av1_selfguided_restoration_sse4_1
                        ((uint8_t *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                         in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58,
                         in_stack_fffffffffffffb54,
                         (int32_t *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
                         (int32_t *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                         in_stack_fffffffffffffb80,in_stack_fffffffffffffb88,
                         in_stack_fffffffffffffb90,in_stack_fffffffffffffb98);
  local_394 = local_3cc;
  if (local_3cc == 0) {
    local_3d8 = av1_sgr_params + local_3b0;
    xq_00 = &local_3e0;
    av1_decode_xq(local_3b8,xq_00,local_3d8);
    local_38c = local_3e0;
    local_4c = local_3e0;
    local_50 = local_3e0;
    local_54 = local_3e0;
    local_58 = local_3e0;
    local_390 = local_3dc;
    local_2c = local_3dc;
    local_30 = local_3dc;
    local_34 = local_3dc;
    local_38 = local_3dc;
    for (local_40c = 0; local_40c < local_3a8; local_40c = local_40c + 1) {
      for (local_410 = 0; local_410 < local_3a4; local_410 = local_410 + 8) {
        iVar21 = local_40c * local_3a4 + local_410;
        iVar22 = local_40c * in_stack_00000010 + local_410;
        a = (void *)(local_3a0 + local_40c * local_3ac + (long)local_410);
        if (in_stack_00000028 == 0) {
          xx_loadl_64(a);
          local_388 = extraout_XMM0._0_8_;
          local_438 = pmovzxbw(extraout_XMM0,local_388);
        }
        else {
          xx_loadu_128((void *)((long)a * 2));
          local_438._8_8_ = extraout_XMM0_Qb;
          local_438._0_8_ = extraout_XMM0_Qa;
        }
        local_368 = local_438._0_8_;
        uStack_360 = local_438._8_8_;
        local_36c = 4;
        local_348 = psllw(local_438,ZEXT416(4));
        auVar24 = pmovzxwd(local_348,local_348._0_8_);
        auVar25 = local_348 >> 0x40;
        local_358._0_8_ = local_348._8_8_;
        auVar26 = pmovzxwd(auVar25,local_358._0_8_);
        local_458 = auVar24._0_8_;
        uStack_450 = auVar24._8_8_;
        local_308 = local_458;
        uVar15 = local_308;
        uStack_300 = uStack_450;
        uVar20 = uStack_300;
        local_30c = 7;
        local_308._0_4_ = auVar24._0_4_;
        iVar14 = (int)local_308;
        local_308._4_4_ = auVar24._4_4_;
        iVar16 = local_308._4_4_;
        uStack_300._0_4_ = auVar24._8_4_;
        iVar17 = (int)uStack_300;
        uStack_300._4_4_ = auVar24._12_4_;
        iVar18 = uStack_300._4_4_;
        iVar23 = (int)local_308 << 7;
        iStack_474 = local_308._4_4_;
        iStack_46c = uStack_300._4_4_;
        uVar30 = auVar26._0_8_;
        uStack_460 = auVar26._8_8_;
        uStack_320 = uStack_460;
        uVar19 = uStack_320;
        local_32c = 7;
        local_328._0_4_ = auVar26._0_4_;
        iVar10 = (int)local_328;
        local_328._4_4_ = auVar26._4_4_;
        iVar11 = local_328._4_4_;
        uStack_320._0_4_ = auVar26._8_4_;
        iVar12 = (int)uStack_320;
        uStack_320._4_4_ = auVar26._12_4_;
        iVar13 = uStack_320._4_4_;
        local_488 = (int)local_328 * 0x80;
        iStack_484 = local_328._4_4_;
        iStack_47c = uStack_320._4_4_;
        iVar28 = (int)uStack_320;
        iVar27 = (int)uStack_300;
        local_358 = auVar25;
        local_328 = uVar30;
        local_308 = uVar15;
        if (0 < local_3d8->r[0]) {
          uStack_320 = uVar19;
          uStack_300 = uVar20;
          xx_loadu_128((void *)(local_3c0 + (long)iVar21 * 4));
          local_298 = local_458;
          uStack_290 = uStack_450;
          local_288 = (int)extraout_XMM0_Qa_00;
          iStack_284 = (int)((ulong)extraout_XMM0_Qa_00 >> 0x20);
          iStack_280 = (int)extraout_XMM0_Qb_00;
          iStack_27c = (int)((ulong)extraout_XMM0_Qb_00 >> 0x20);
          local_1c8 = CONCAT44(iVar16,iVar23);
          uStack_1c0 = CONCAT44(iVar18,iVar27);
          local_158 = CONCAT44(iStack_284 - iVar16,local_288 - iVar14);
          uStack_150 = CONCAT44(iStack_27c - iVar18,iStack_280 - iVar17);
          auVar5._8_8_ = CONCAT44(local_3e0,local_3e0);
          auVar5._0_8_ = CONCAT44(local_3e0,local_3e0);
          auVar26._8_8_ = uStack_150;
          auVar26._0_8_ = local_158;
          local_1d8 = pmulld(auVar5,auVar26);
          iVar23 = iVar23 + local_1d8._0_4_;
          iStack_474 = iVar16 + local_1d8._4_4_;
          iVar27 = iVar27 + local_1d8._8_4_;
          iStack_46c = iVar18 + local_1d8._12_4_;
          xx_loadu_128((void *)(local_3c0 + (long)(iVar21 + 4) * 4));
          uStack_2b0 = uStack_460;
          local_2a8 = (int)extraout_XMM0_Qa_01;
          iStack_2a4 = (int)((ulong)extraout_XMM0_Qa_01 >> 0x20);
          iStack_2a0 = (int)extraout_XMM0_Qb_01;
          iStack_29c = (int)((ulong)extraout_XMM0_Qb_01 >> 0x20);
          local_1e8 = CONCAT44(iVar11,local_488);
          uStack_1e0 = CONCAT44(iVar13,iVar28);
          local_178 = CONCAT44(iStack_2a4 - iVar11,local_2a8 - iVar10);
          uStack_170 = CONCAT44(iStack_29c - iVar13,iStack_2a0 - iVar12);
          auVar25._8_8_ = CONCAT44(local_3e0,local_3e0);
          auVar25._0_8_ = CONCAT44(local_3e0,local_3e0);
          auVar24._8_8_ = uStack_170;
          auVar24._0_8_ = local_178;
          local_1f8 = pmulld(auVar25,auVar24);
          local_488 = local_488 + local_1f8._0_4_;
          iStack_484 = iVar11 + local_1f8._4_4_;
          iVar28 = iVar28 + local_1f8._8_4_;
          iStack_47c = iVar13 + local_1f8._12_4_;
          uVar19 = uStack_320;
          uVar20 = uStack_300;
          local_2b8 = uVar30;
        }
        uStack_300 = uVar20;
        uStack_320 = uVar19;
        if (0 < local_3d8->r[1]) {
          xx_loadu_128((void *)(local_3c8 + (long)iVar21 * 4));
          local_2d8 = local_458;
          uStack_2d0 = uStack_450;
          local_2c8 = (int)extraout_XMM0_Qa_02;
          iStack_2c4 = (int)((ulong)extraout_XMM0_Qa_02 >> 0x20);
          iStack_2c0 = (int)extraout_XMM0_Qb_02;
          iStack_2bc = (int)((ulong)extraout_XMM0_Qb_02 >> 0x20);
          local_208 = CONCAT44(iStack_474,iVar23);
          uStack_200 = CONCAT44(iStack_46c,iVar27);
          local_198 = CONCAT44(iStack_2c4 - iVar16,local_2c8 - iVar14);
          uStack_190 = CONCAT44(iStack_2bc - iVar18,iStack_2c0 - iVar17);
          auVar4._8_8_ = CONCAT44(local_3dc,local_3dc);
          auVar4._0_8_ = CONCAT44(local_3dc,local_3dc);
          auVar3._8_8_ = uStack_190;
          auVar3._0_8_ = local_198;
          local_218 = pmulld(auVar4,auVar3);
          iVar23 = iVar23 + local_218._0_4_;
          iStack_474 = iStack_474 + local_218._4_4_;
          iVar27 = iVar27 + local_218._8_4_;
          iStack_46c = iStack_46c + local_218._12_4_;
          xx_loadu_128((void *)(local_3c8 + (long)(iVar21 + 4) * 4));
          uStack_2f0 = uStack_460;
          local_2e8 = (int)extraout_XMM0_Qa_03;
          iStack_2e4 = (int)((ulong)extraout_XMM0_Qa_03 >> 0x20);
          iStack_2e0 = (int)extraout_XMM0_Qb_03;
          iStack_2dc = (int)((ulong)extraout_XMM0_Qb_03 >> 0x20);
          local_228 = CONCAT44(iStack_484,local_488);
          uStack_220 = CONCAT44(iStack_47c,iVar28);
          local_1b8 = CONCAT44(iStack_2e4 - iVar11,local_2e8 - iVar10);
          uStack_1b0 = CONCAT44(iStack_2dc - iVar13,iStack_2e0 - iVar12);
          auVar2._8_8_ = CONCAT44(local_3dc,local_3dc);
          auVar2._0_8_ = CONCAT44(local_3dc,local_3dc);
          auVar1._8_8_ = uStack_1b0;
          auVar1._0_8_ = local_1b8;
          local_238 = pmulld(auVar2,auVar1);
          local_488 = local_488 + local_238._0_4_;
          iStack_484 = iStack_484 + local_238._4_4_;
          iVar28 = iVar28 + local_238._8_4_;
          iStack_47c = iStack_47c + local_238._12_4_;
          local_2f8 = uVar30;
        }
        alVar29 = round_for_shift(0xb);
        local_248 = CONCAT44(iStack_474,iVar23);
        uStack_240 = CONCAT44(iStack_46c,iVar27);
        local_258 = (int)extraout_XMM0_Qa_04;
        iStack_254 = (int)((ulong)extraout_XMM0_Qa_04 >> 0x20);
        iStack_250 = (int)extraout_XMM0_Qb_04;
        iStack_24c = (int)((ulong)extraout_XMM0_Qb_04 >> 0x20);
        local_108 = iVar23 + local_258;
        iStack_104 = iStack_474 + iStack_254;
        iStack_100 = iVar27 + iStack_250;
        iStack_fc = iStack_46c + iStack_24c;
        local_10c = 0xb;
        auVar24 = ZEXT416(0xb);
        local_268 = CONCAT44(iStack_484,local_488);
        uStack_260 = CONCAT44(iStack_47c,iVar28);
        local_128 = local_488 + local_258;
        iStack_124 = iStack_484 + iStack_254;
        iStack_120 = iVar28 + iStack_250;
        iStack_11c = iStack_47c + iStack_24c;
        local_12c = 0xb;
        auVar25 = ZEXT416(0xb);
        if (in_stack_00000028 == 0) {
          local_98 = CONCAT44(iStack_104 >> auVar24,local_108 >> auVar24);
          uStack_90 = CONCAT44(iStack_fc >> auVar24,iStack_100 >> auVar24);
          local_a8 = CONCAT44(iStack_124 >> auVar25,local_128 >> auVar25);
          uStack_a0 = CONCAT44(iStack_11c >> auVar25,iStack_120 >> auVar25);
          auVar9._8_8_ = uStack_90;
          auVar9._0_8_ = local_98;
          auVar8._8_8_ = uStack_a0;
          auVar8._0_8_ = local_a8;
          auVar24 = packssdw(auVar9,auVar8);
          local_538 = auVar24._0_8_;
          uStackY_530 = auVar24._8_8_;
          local_78 = local_538;
          uStack_70 = uStackY_530;
          local_88 = local_538;
          uStack_80 = uStackY_530;
          v[1] = alVar29[1];
          v[0] = (longlong)xq_00;
          xx_storel_64((void *)(in_stack_00000008 + iVar22),v);
        }
        else {
          local_e8 = CONCAT44(iStack_104 >> auVar24,local_108 >> auVar24);
          uStack_e0 = CONCAT44(iStack_fc >> auVar24,iStack_100 >> auVar24);
          local_f8 = CONCAT44(iStack_124 >> auVar25,local_128 >> auVar25);
          uStack_f0 = CONCAT44(iStack_11c >> auVar25,iStack_120 >> auVar25);
          auVar7._8_8_ = uStack_e0;
          auVar7._0_8_ = local_e8;
          auVar6._8_8_ = uStack_f0;
          auVar6._0_8_ = local_f8;
          auVar24 = packusdw(auVar7,auVar6);
          local_ca = (short)(1 << (in_stack_00000020 & 0x1f)) + -1;
          local_c8 = CONCAT26(local_ca,CONCAT24(local_ca,CONCAT22(local_ca,local_ca)));
          uStack_c0 = CONCAT26(local_ca,CONCAT24(local_ca,CONCAT22(local_ca,local_ca)));
          local_508 = auVar24._0_8_;
          uStackY_500 = auVar24._8_8_;
          local_b8 = local_508;
          uStack_b0 = uStackY_500;
          alVar29[0] = (longlong)xq_00;
          local_28 = local_c8;
          uStack_20 = uStack_c0;
          local_18 = local_ca;
          local_16 = local_ca;
          local_14 = local_ca;
          local_12 = local_ca;
          local_10 = local_ca;
          local_e = local_ca;
          local_c = local_ca;
          local_a = local_ca;
          xx_storeu_128((void *)((in_stack_00000008 + iVar22) * 2),alVar29);
        }
      }
    }
    local_394 = 0;
  }
  return local_394;
}

Assistant:

int av1_apply_selfguided_restoration_sse4_1(const uint8_t *dat8, int width,
                                            int height, int stride, int eps,
                                            const int *xqd, uint8_t *dst8,
                                            int dst_stride, int32_t *tmpbuf,
                                            int bit_depth, int highbd) {
  int32_t *flt0 = tmpbuf;
  int32_t *flt1 = flt0 + RESTORATION_UNITPELS_MAX;
  assert(width * height <= RESTORATION_UNITPELS_MAX);
  const int ret = av1_selfguided_restoration_sse4_1(
      dat8, width, height, stride, flt0, flt1, width, eps, bit_depth, highbd);
  if (ret != 0) return ret;
  const sgr_params_type *const params = &av1_sgr_params[eps];
  int xq[2];
  av1_decode_xq(xqd, xq, params);

  __m128i xq0 = _mm_set1_epi32(xq[0]);
  __m128i xq1 = _mm_set1_epi32(xq[1]);

  for (int i = 0; i < height; ++i) {
    // Calculate output in batches of 8 pixels
    for (int j = 0; j < width; j += 8) {
      const int k = i * width + j;
      const int m = i * dst_stride + j;

      const uint8_t *dat8ij = dat8 + i * stride + j;
      __m128i src;
      if (highbd) {
        src = xx_loadu_128(CONVERT_TO_SHORTPTR(dat8ij));
      } else {
        src = _mm_cvtepu8_epi16(xx_loadl_64(dat8ij));
      }

      const __m128i u = _mm_slli_epi16(src, SGRPROJ_RST_BITS);
      const __m128i u_0 = _mm_cvtepu16_epi32(u);
      const __m128i u_1 = _mm_cvtepu16_epi32(_mm_srli_si128(u, 8));

      __m128i v_0 = _mm_slli_epi32(u_0, SGRPROJ_PRJ_BITS);
      __m128i v_1 = _mm_slli_epi32(u_1, SGRPROJ_PRJ_BITS);

      if (params->r[0] > 0) {
        const __m128i f1_0 = _mm_sub_epi32(xx_loadu_128(&flt0[k]), u_0);
        v_0 = _mm_add_epi32(v_0, _mm_mullo_epi32(xq0, f1_0));

        const __m128i f1_1 = _mm_sub_epi32(xx_loadu_128(&flt0[k + 4]), u_1);
        v_1 = _mm_add_epi32(v_1, _mm_mullo_epi32(xq0, f1_1));
      }

      if (params->r[1] > 0) {
        const __m128i f2_0 = _mm_sub_epi32(xx_loadu_128(&flt1[k]), u_0);
        v_0 = _mm_add_epi32(v_0, _mm_mullo_epi32(xq1, f2_0));

        const __m128i f2_1 = _mm_sub_epi32(xx_loadu_128(&flt1[k + 4]), u_1);
        v_1 = _mm_add_epi32(v_1, _mm_mullo_epi32(xq1, f2_1));
      }

      const __m128i rounding =
          round_for_shift(SGRPROJ_PRJ_BITS + SGRPROJ_RST_BITS);
      const __m128i w_0 = _mm_srai_epi32(_mm_add_epi32(v_0, rounding),
                                         SGRPROJ_PRJ_BITS + SGRPROJ_RST_BITS);
      const __m128i w_1 = _mm_srai_epi32(_mm_add_epi32(v_1, rounding),
                                         SGRPROJ_PRJ_BITS + SGRPROJ_RST_BITS);

      if (highbd) {
        // Pack into 16 bits and clamp to [0, 2^bit_depth)
        const __m128i tmp = _mm_packus_epi32(w_0, w_1);
        const __m128i max = _mm_set1_epi16((1 << bit_depth) - 1);
        const __m128i res = _mm_min_epi16(tmp, max);
        xx_storeu_128(CONVERT_TO_SHORTPTR(dst8 + m), res);
      } else {
        // Pack into 8 bits and clamp to [0, 256)
        const __m128i tmp = _mm_packs_epi32(w_0, w_1);
        const __m128i res = _mm_packus_epi16(tmp, tmp /* "don't care" value */);
        xx_storel_64(dst8 + m, res);
      }
    }
  }
  return 0;
}